

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O1

void test_quadrature<WeightedPolynomial<ChebyshevT3WeightFunction>,IntegratorXX::GaussChebyshev3<double,double>,std::vector<double,std::allocator<double>>&>
               (string *msg,GaussChebyshev3<double,_double> *quad,double ref,double e,
               vector<double,_std::allocator<double>_> *args)

{
  pointer pcVar1;
  ulong uVar2;
  double dVar3;
  StringRef macroName;
  StringRef capturedExpression;
  double res;
  AssertionHandler catchAssertionHandler;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  string local_120;
  vector<double,_std::allocator<double>_> local_100;
  AssertionHandler local_e8;
  ITransientExpression local_a0;
  double *local_90;
  WithinAbsMatcher *local_88;
  WithinAbsMatcher local_80;
  
  local_140 = 0.0;
  local_138 = ref;
  local_130 = e;
  if ((quad->super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>).
      super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
      .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (quad->super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>).
      super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
      .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar2 = 0;
    do {
      local_128 = (quad->super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>).
                  super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                  .weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2];
      std::vector<double,_std::allocator<double>_>::vector(&local_100,args);
      dVar3 = WeightedPolynomial<ChebyshevT3WeightFunction>::evaluate
                        (&local_100,
                         *(double *)
                          ((long)(quad->
                                 super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>).
                                 super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                                 .points_.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar2 * 8));
      local_140 = local_128 * dVar3 + local_140;
      if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(quad->
                                   super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>)
                                   .
                                   super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                                   .points_.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(quad->
                                   super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>)
                                   .
                                   super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                                   .points_.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_80.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x16f2c9;
  local_80.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x79;
  macroName.m_size = 0xc;
  macroName.m_start = "REQUIRE_THAT";
  capturedExpression.m_size = 0x33;
  capturedExpression.m_start = "res, IntegratorXX::Matchers::WithinAbs(msg, ref, e)";
  Catch::AssertionHandler::AssertionHandler
            (&local_e8,macroName,(SourceLineInfo *)&local_80,capturedExpression,Normal);
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar1,pcVar1 + msg->_M_string_length);
  IntegratorXX::Matchers::WithinAbs(&local_80,&local_120,local_138,local_130);
  local_a0.m_result = IntegratorXX::Matchers::WithinAbsMatcher::match(&local_80,&local_140);
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_012a9150;
  local_90 = &local_140;
  local_88 = &local_80;
  Catch::AssertionHandler::handleExpr(&local_e8,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_msg._M_dataplus._M_p != &local_80.m_msg.field_2) {
    operator_delete(local_80.m_msg._M_dataplus._M_p,local_80.m_msg.field_2._M_allocated_capacity + 1
                   );
  }
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  Catch::AssertionHandler::complete(&local_e8);
  if (local_e8.m_completed == false) {
    (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void test_quadrature(std::string msg, const QuadType& quad, double ref, double e, PreArgs&&... args) {
  const auto& pts = quad.points();
  const auto& wgt = quad.weights();

  double res = 0.0;
  for(auto i = 0; i < quad.npts(); ++i) {
    res += wgt[i] * TestFunction::evaluate(args..., pts[i]);
  }
  
  //standard_matcher(mes, res, ref, e);
  //printf("diff = %.6e\n", std::abs(ref - res));
  REQUIRE_THAT(res, IntegratorXX::Matchers::WithinAbs(msg, ref, e));
}